

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_SetConstVar(Zyx_Man_t *p,int Var,int Value)

{
  int *piVar1;
  int iVar2;
  int iLit;
  int local_1c;
  
  if (Var < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_1c = (uint)(Value == 0) + Var * 2;
  iVar2 = bmcg_sat_solver_addclause(p->pSat,&local_1c,1);
  if (iVar2 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x26f,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
  }
  if (p->vVarValues->nSize <= Var) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar1 = p->vVarValues->pArray;
  if (piVar1[(uint)Var] == -1) {
    piVar1[(uint)Var] = Value;
    return;
  }
  __assert_fail("Vec_IntEntry(p->vVarValues, Var) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                ,0x270,"void Zyx_SetConstVar(Zyx_Man_t *, int, int)");
}

Assistant:

void Zyx_SetConstVar( Zyx_Man_t * p, int Var, int Value )
{
    int iLit = Abc_Var2Lit( Var, !Value );
    int status = bmcg_sat_solver_addclause( p->pSat, &iLit, 1 );
    assert( status );
    assert( Vec_IntEntry(p->vVarValues, Var) == -1 );
    Vec_IntWriteEntry( p->vVarValues, Var, Value );
    //printf( "Setting var %d to value %d.\n", Var, Value );
}